

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

int __thiscall
lossless_neural_sound::expression_compiler::expression::Transfer_function::
structurally_compare_implementation(Transfer_function *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  Node *pNVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x575,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Transfer_function::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 == (_func_int **)&PTR__Node_0012ed00) {
    pNVar2 = rt[1].super_Node.hash_next;
    if ((Node *)this->derivative_count < pNVar2) {
      uVar4 = 0xffffffff;
    }
    else {
      if ((Node *)this->derivative_count <= pNVar2) {
        iVar5 = Expression_node::structurally_compare
                          (this->arg,(Expression_node *)rt[1].super_Node._vptr_Node);
        return iVar5;
      }
      uVar4 = 1;
    }
  }
  else {
    uVar3 = (*pp_Var1[6])(rt);
    uVar4 = 0xffffffff;
    if (uVar3 < 5) {
      uVar4 = (uint)(uVar3 != 4);
    }
  }
  return uVar4;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *fn = dynamic_cast<const Transfer_function *>(rt))
        {
            if(derivative_count < fn->derivative_count)
                return -1;
            if(derivative_count > fn->derivative_count)
                return 1;
            return arg->structurally_compare(fn->arg);
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Transfer_function < rt_kind)
            return -1;
        if(Kind::Transfer_function > rt_kind)
            return 1;
        return 0;
    }